

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall
SeedTree::SeedTree(SeedTree *this,reveal_list_t *reveallist,size_t num_leaves,limbo_salt_t *salt,
                  size_t rep_idx)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer poVar1;
  int iVar2;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *seed;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong idx;
  size_type sVar7;
  SeedTree *this_01;
  size_t idx_00;
  SeedTree *idx_01;
  size_t sVar8;
  long lVar9;
  long lVar10;
  reference rVar11;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  _Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_50;
  
  this_00 = &this->_node_exists;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)
   &(this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_node_exists).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).
  super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_num_leaves = num_leaves;
  uVar5 = (int)num_leaves - 1;
  if (uVar5 == 0) {
    bVar4 = 0;
  }
  else {
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bVar4 = (byte)iVar2 ^ 0x1f;
  }
  bVar4 = 0x20 - bVar4;
  if ((int)num_leaves == 0) {
    bVar4 = 0;
  }
  sVar7 = ((long)(2 << (bVar4 & 0x1f)) + (num_leaves - (long)(1 << (bVar4 & 0x1f)))) - 1;
  this->_num_total_nodes = sVar7;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,sVar7,false);
  sVar8 = this->_num_total_nodes;
  for (uVar6 = sVar8 - num_leaves; uVar6 < sVar8; uVar6 = uVar6 + 1) {
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar6);
    *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
    sVar8 = this->_num_total_nodes;
  }
  idx_00 = sVar8 * 2 + num_leaves * -2 + 1;
  sVar7 = sVar8 - num_leaves;
  while (sVar7 != 0) {
    bVar3 = node_exists(this,idx_00);
    if (bVar3) {
LAB_0011073f:
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar7);
      *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
    }
    else {
      bVar3 = node_exists(this,idx_00 + 1);
      if (bVar3) goto LAB_0011073f;
    }
    idx_00 = idx_00 - 2;
    sVar7 = sVar7 - 1;
  }
  rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
  std::
  vector<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::resize(&this->_data,this->_num_total_nodes);
  uVar6 = (this->_num_total_nodes + reveallist->second) - this->_num_leaves;
  lVar9 = 0;
  do {
    if (uVar6 == 0) {
      uVar6 = this->_num_total_nodes;
      lVar9 = 0x20;
      sVar8 = 1;
      lVar10 = 0;
      for (idx_01 = (SeedTree *)0x0; idx_01 <= (SeedTree *)((uVar6 >> 1) - 1);
          idx_01 = (SeedTree *)
                   ((long)&(idx_01->_data).
                           super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1)) {
        this_01 = idx_01;
        bVar3 = node_exists(this,(size_t)idx_01);
        if ((bVar3) &&
           (poVar1 = (this->_data).
                     super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(char *)((long)&(poVar1->
                            super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                            )._M_payload + lVar10 + 0x18) != '\0')) {
          seed = std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
                           ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
                            )((long)&(poVar1->
                                     super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                     )._M_payload + lVar10));
          expandSeed(&local_80,this_01,seed,salt,rep_idx,(size_t)idx_01);
          bVar3 = node_exists(this,sVar8);
          if (bVar3) {
            std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
            _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_50,&local_80);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(((this->_data).
                                          super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        )._M_payload + lVar9),&local_50);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_reset(&local_50);
          }
          bVar3 = node_exists(this,sVar8 + 1);
          if (bVar3) {
            std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
            _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&local_50,&local_80.second);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)((long)&(this->_data).
                                        super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1].
                                        super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
                                        ._M_payload + lVar9),&local_50);
            std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::_M_reset(&local_50);
          }
          std::
          pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~pair(&local_80);
        }
        lVar10 = lVar10 + 0x20;
        lVar9 = lVar9 + 0x40;
        sVar8 = sVar8 + 2;
      }
      return;
    }
    bVar3 = node_exists(this,uVar6);
    if (bVar3) {
      if ((uVar6 & 1) == 0) {
        idx = uVar6 - 1;
      }
      else {
        idx = uVar6 + 1;
        bVar3 = node_exists(this,idx);
        if (!bVar3) goto LAB_001107ed;
        if (this->_num_total_nodes <= idx) {
          idx = 0;
        }
      }
      std::_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
      _Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                ((_Optional_payload_base<std::vector<unsigned_char,std::allocator<unsigned_char>>> *
                 )&local_80,
                 (long)&(((reveallist->first).
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl +
                 lVar9);
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_move_assign((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)((this->_data).
                         super__Vector_base<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + idx),
                     (_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&local_80);
      std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_80);
    }
LAB_001107ed:
    uVar6 = (uVar6 + 1 >> 1) - 1;
    lVar9 = lVar9 + 0x18;
  } while( true );
}

Assistant:

SeedTree::SeedTree(const reveal_list_t &reveallist, const size_t num_leaves,
                   const limbo_salt_t &salt, const size_t rep_idx)
    : _data(), _node_exists(), _num_leaves(num_leaves) {
  size_t tree_depth = 1 + ceil_log2(num_leaves);

  _num_total_nodes =
      ((1 << (tree_depth)) - 1) -
      ((1 << (tree_depth - 1)) -
       num_leaves); /* Num nodes in complete - number of missing leaves */

  _node_exists.resize(_num_total_nodes);
  for (size_t i = _num_total_nodes - num_leaves; i < _num_total_nodes; i++) {
    _node_exists[i] = true;
  }

  for (size_t i = _num_total_nodes - num_leaves; i > 0; i--) {
    if (node_exists(2 * i + 1) || node_exists(2 * i + 2)) {
      _node_exists[i] = true;
    }
  }
  _node_exists[0] = true;
  _data.resize(_num_total_nodes);

  auto has_sibling = [this](size_t node) -> bool {
    if (!node_exists(node)) {
      return 0;
    }

    if ((node % 2 == 1) && !node_exists(node + 1)) {
      return 0;
    }

    return 1;
  };

  auto get_sibling = [this, has_sibling](size_t node) -> size_t {
    assert(node < _num_total_nodes);
    assert(node != 0);
    assert(has_sibling(node));
    if ((node % 2 == 1)) {
      if (node + 1 < _num_total_nodes) {
        return node + 1;
      } else {
        assert(!"getSibling: request for node with no sibling");
        return 0;
      }
    } else {
      return node - 1;
    }
  };

  size_t missing_leaf = reveallist.second;
  size_t first_leaf_idx = _num_total_nodes - _num_leaves;
  size_t path_idx = 0;
  for (size_t node = first_leaf_idx + missing_leaf; node != 0;
       node = get_parent(node)) {
    if (!has_sibling(node)) {
      path_idx++;
      continue;
    }
    size_t sibling = get_sibling(node);
    _data[sibling] = std::optional(reveallist.first[path_idx]);
    path_idx++;
  }

  size_t last_non_leaf = get_parent(_num_total_nodes - 1);
  for (size_t i = 0; i <= last_non_leaf; i++) {
    if (!node_exists(i) || !_data[i].has_value())
      continue;
    auto [left, right] = expandSeed(_data[i].value(), salt, rep_idx, i);
    if (node_exists(2 * i + 1)) {
      _data[2 * i + 1] = std::optional(left);
    }
    if (node_exists(2 * i + 2)) {
      _data[2 * i + 2] = std::optional(right);
    }
  }
}